

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbFunc.c
# Opt level: O1

char * Acb_EnumerateSatAssigns
                 (sat_solver *pSat,int PivotVar,int FreeVar,Vec_Int_t *vDivVars,Vec_Int_t *vTempLits
                 ,Vec_Str_t *vTempSop)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  long lVar5;
  int i;
  sat_solver *psVar6;
  int iVar7;
  uint uVar8;
  long lVar9;
  uint uVar10;
  ulong uVar11;
  size_t sVar12;
  int pLits [2];
  uint local_48;
  uint local_44;
  sat_solver *local_40;
  ulong local_38;
  
  local_40 = pSat;
  iVar3 = sat_solver_nvars(pSat);
  if (iVar3 <= FreeVar) {
    __assert_fail("FreeVar < sat_solver_nvars(pSat)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acbFunc.c"
                  ,0x5e6,
                  "char *Acb_EnumerateSatAssigns(sat_solver *, int, int, Vec_Int_t *, Vec_Int_t *, Vec_Str_t *)"
                 );
  }
  if ((PivotVar < 0) || (local_48 = PivotVar * 2 + 1, FreeVar < 0)) {
    __assert_fail("Var >= 0 && !(c >> 1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                  ,0x12e,"int Abc_Var2Lit(int, int)");
  }
  local_44 = FreeVar * 2;
  vTempSop->nSize = 0;
  iVar3 = vDivVars->nSize * 8 + 0x19;
  if (vTempSop->nCap < iVar3) {
    if (vTempSop->pArray == (char *)0x0) {
      pcVar4 = (char *)malloc((long)iVar3);
    }
    else {
      pcVar4 = (char *)realloc(vTempSop->pArray,(long)iVar3);
    }
    vTempSop->pArray = pcVar4;
    vTempSop->nCap = iVar3;
  }
  psVar6 = local_40;
  iVar3 = sat_solver_solve(local_40,(lit *)&local_48,(lit *)&local_40,0,0,0,0);
  if (iVar3 == -1) {
    uVar10 = vTempSop->nCap;
    if (vTempSop->nSize == uVar10) {
      if ((int)uVar10 < 0x10) {
        if (vTempSop->pArray == (char *)0x0) {
          pcVar4 = (char *)malloc(0x10);
        }
        else {
          pcVar4 = (char *)realloc(vTempSop->pArray,0x10);
        }
        vTempSop->pArray = pcVar4;
        sVar12 = 0x10;
      }
      else {
        sVar12 = (ulong)uVar10 * 2;
        if ((int)sVar12 <= (int)uVar10) goto LAB_003964b6;
        if (vTempSop->pArray == (char *)0x0) {
          pcVar4 = (char *)malloc(sVar12);
        }
        else {
          pcVar4 = (char *)realloc(vTempSop->pArray,sVar12);
        }
        vTempSop->pArray = pcVar4;
      }
      vTempSop->nCap = (int)sVar12;
    }
LAB_003964b6:
    iVar3 = vTempSop->nSize;
    vTempSop->nSize = iVar3 + 1;
    vTempSop->pArray[iVar3] = ' ';
    uVar10 = vTempSop->nCap;
    if (vTempSop->nSize == uVar10) {
      if ((int)uVar10 < 0x10) {
        if (vTempSop->pArray == (char *)0x0) {
          pcVar4 = (char *)malloc(0x10);
        }
        else {
          pcVar4 = (char *)realloc(vTempSop->pArray,0x10);
        }
        sVar12 = 0x10;
      }
      else {
        sVar12 = (ulong)uVar10 * 2;
        if ((int)sVar12 <= (int)uVar10) goto LAB_00396525;
        if (vTempSop->pArray == (char *)0x0) {
          pcVar4 = (char *)malloc(sVar12);
        }
        else {
          pcVar4 = (char *)realloc(vTempSop->pArray,sVar12);
        }
      }
      vTempSop->pArray = pcVar4;
      vTempSop->nCap = (int)sVar12;
    }
LAB_00396525:
    iVar3 = vTempSop->nSize;
    vTempSop->nSize = iVar3 + 1;
    vTempSop->pArray[iVar3] = '0';
  }
  else {
    if ((int)local_48 < 0) {
LAB_003966bb:
      __assert_fail("Lit >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                    ,0x131,"int Abc_LitNot(int)");
    }
    local_48 = local_48 ^ 1;
    iVar3 = sat_solver_solve(psVar6,(lit *)&local_48,(lit *)&local_40,0,0,0,0);
    if ((int)local_48 < 0) goto LAB_003966bb;
    local_48 = local_48 ^ 1;
    if ((iVar3 != -1) && (vDivVars->nSize != 0)) {
      uVar11 = 0;
      do {
        iVar3 = sat_solver_solve(psVar6,(lit *)&local_48,(lit *)&local_40,0,0,0,0);
        if (iVar3 != 1) {
          if (iVar3 != -1) {
            __assert_fail("status == l_True",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acbFunc.c"
                          ,0x623,
                          "char *Acb_EnumerateSatAssigns(sat_solver *, int, int, Vec_Int_t *, Vec_Int_t *, Vec_Str_t *)"
                         );
          }
          printf("Finished enumerating %d cubes.\n",uVar11);
          uVar10 = vTempSop->nCap;
          if (vTempSop->nSize != uVar10) goto LAB_003965ff;
          if (0xf < (int)uVar10) goto LAB_003965ca;
          if (vTempSop->pArray == (char *)0x0) {
            pcVar4 = (char *)malloc(0x10);
          }
          else {
            pcVar4 = (char *)realloc(vTempSop->pArray,0x10);
          }
          vTempSop->pArray = pcVar4;
          iVar3 = 0x10;
          goto LAB_003965fc;
        }
        vTempLits->nSize = 0;
        if ((int)local_48 < 0) goto LAB_003966bb;
        Vec_IntPush(vTempLits,local_48 ^ 1);
        lVar5 = (long)vDivVars->nSize;
        if (0 < (long)vDivVars->nSize) {
          do {
            if (vDivVars->nSize < lVar5) goto LAB_0039669c;
            iVar3 = vDivVars->pArray[lVar5 + -1];
            if (((long)iVar3 < 0) || (psVar6->size <= iVar3)) {
              __assert_fail("v >= 0 && v < s->size",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver.h"
                            ,0xdf,"int sat_solver_var_literal(sat_solver *, int)");
            }
            Vec_IntPush(vTempLits,(uint)(psVar6->model[iVar3] != 1) + iVar3 * 2);
            bVar2 = 1 < lVar5;
            lVar5 = lVar5 + -1;
          } while (bVar2);
        }
        local_38 = uVar11;
        if (0 < vDivVars->nSize) {
          iVar3 = 0;
          do {
            uVar10 = vTempSop->nCap;
            if (vTempSop->nSize == uVar10) {
              if ((int)uVar10 < 0x10) {
                if (vTempSop->pArray == (char *)0x0) {
                  pcVar4 = (char *)malloc(0x10);
                }
                else {
                  pcVar4 = (char *)realloc(vTempSop->pArray,0x10);
                }
                vTempSop->pArray = pcVar4;
                sVar12 = 0x10;
              }
              else {
                sVar12 = (ulong)uVar10 * 2;
                if ((int)sVar12 <= (int)uVar10) goto LAB_00396092;
                if (vTempSop->pArray == (char *)0x0) {
                  pcVar4 = (char *)malloc(sVar12);
                }
                else {
                  pcVar4 = (char *)realloc(vTempSop->pArray,sVar12);
                }
                vTempSop->pArray = pcVar4;
              }
              vTempSop->nCap = (int)sVar12;
            }
LAB_00396092:
            iVar7 = vTempSop->nSize;
            vTempSop->nSize = iVar7 + 1;
            vTempSop->pArray[iVar7] = '-';
            iVar3 = iVar3 + 1;
          } while (iVar3 < vDivVars->nSize);
        }
        psVar6 = local_40;
        if (vTempLits->nSize < 1) {
LAB_0039669c:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        iVar3 = sat_solver_push(local_40,*vTempLits->pArray);
        if (iVar3 != 1) {
          __assert_fail("status == 1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acbFunc.c"
                        ,0x636,
                        "char *Acb_EnumerateSatAssigns(sat_solver *, int, int, Vec_Int_t *, Vec_Int_t *, Vec_Str_t *)"
                       );
        }
        iVar3 = sat_solver_minimize_assumptions
                          (psVar6,vTempLits->pArray + 1,vTempLits->nSize + -1,0);
        if (vTempLits->nSize <= iVar3) {
          __assert_fail("p->nSize >= nSizeNew",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x2b7,"void Vec_IntShrink(Vec_Int_t *, int)");
        }
        vTempLits->nSize = iVar3 + 1;
        sat_solver_pop(psVar6);
        if ((int)local_44 < 0) goto LAB_003966bb;
        if (vTempLits->nSize < 1) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
        }
        *vTempLits->pArray = local_44 ^ 1;
        if (1 < vTempLits->nSize) {
          lVar5 = 1;
          do {
            uVar10 = vTempLits->pArray[lVar5];
            if ((int)uVar10 < 0) goto LAB_003966bb;
            vTempLits->pArray[lVar5] = uVar10 ^ 1;
            iVar3 = vDivVars->nSize;
            iVar7 = -1;
            if (0 < (long)iVar3) {
              lVar9 = 0;
              do {
                if (vDivVars->pArray[lVar9] == uVar10 >> 1) {
                  iVar7 = (int)lVar9;
                  break;
                }
                lVar9 = lVar9 + 1;
              } while (iVar3 != lVar9);
            }
            if (iVar7 < 0) {
              __assert_fail("iVar >= 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acbFunc.c"
                            ,0x63f,
                            "char *Acb_EnumerateSatAssigns(sat_solver *, int, int, Vec_Int_t *, Vec_Int_t *, Vec_Str_t *)"
                           );
            }
            uVar8 = (vTempSop->nSize - iVar3) + iVar7;
            if (((int)uVar8 < 0) || (vTempSop->nSize <= (int)uVar8)) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecStr.h"
                            ,0x186,"void Vec_StrWriteEntry(Vec_Str_t *, int, char)");
            }
            vTempSop->pArray[uVar8] = (byte)uVar10 & 1 ^ 0x31;
            lVar5 = lVar5 + 1;
          } while (lVar5 < vTempLits->nSize);
        }
        lVar5 = 0;
        do {
          cVar1 = ".names n%0*d\n 1\n"[lVar5 + 0xd];
          uVar10 = vTempSop->nCap;
          if (vTempSop->nSize == uVar10) {
            if ((int)uVar10 < 0x10) {
              if (vTempSop->pArray == (char *)0x0) {
                pcVar4 = (char *)malloc(0x10);
              }
              else {
                pcVar4 = (char *)realloc(vTempSop->pArray,0x10);
              }
              sVar12 = 0x10;
            }
            else {
              sVar12 = (ulong)uVar10 * 2;
              if ((int)sVar12 <= (int)uVar10) goto LAB_00396225;
              if (vTempSop->pArray == (char *)0x0) {
                pcVar4 = (char *)malloc(sVar12);
              }
              else {
                pcVar4 = (char *)realloc(vTempSop->pArray,sVar12);
              }
            }
            vTempSop->pArray = pcVar4;
            vTempSop->nCap = (int)sVar12;
          }
LAB_00396225:
          psVar6 = local_40;
          iVar3 = vTempSop->nSize;
          vTempSop->nSize = iVar3 + 1;
          vTempSop->pArray[iVar3] = cVar1;
          lVar5 = lVar5 + 1;
        } while (lVar5 != 3);
        iVar3 = sat_solver_addclause
                          (local_40,vTempLits->pArray,vTempLits->pArray + vTempLits->nSize);
        if (iVar3 == 0) {
          __assert_fail("status",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acbFunc.c"
                        ,0x68f,
                        "char *Acb_EnumerateSatAssigns(sat_solver *, int, int, Vec_Int_t *, Vec_Int_t *, Vec_Str_t *)"
                       );
        }
        uVar10 = (int)local_38 + 1;
        uVar11 = (ulong)uVar10;
      } while (uVar10 != 1000);
      if (vDivVars->nSize != 0) {
        puts("Reached the limit on the number of cubes (1000).");
        return (char *)0x0;
      }
      puts("Assuming constant 0 function.");
      vTempSop->nSize = 0;
      if (vTempSop->nCap == 0) {
        if (vTempSop->pArray == (char *)0x0) {
          pcVar4 = (char *)malloc(0x10);
        }
        else {
          pcVar4 = (char *)realloc(vTempSop->pArray,0x10);
        }
        vTempSop->pArray = pcVar4;
        vTempSop->nCap = 0x10;
      }
      goto LAB_003964b6;
    }
    uVar10 = vTempSop->nCap;
    if (vTempSop->nSize == uVar10) {
      if ((int)uVar10 < 0x10) {
        if (vTempSop->pArray == (char *)0x0) {
          pcVar4 = (char *)malloc(0x10);
        }
        else {
          pcVar4 = (char *)realloc(vTempSop->pArray,0x10);
        }
        vTempSop->pArray = pcVar4;
        sVar12 = 0x10;
      }
      else {
        sVar12 = (ulong)uVar10 * 2;
        if ((int)sVar12 <= (int)uVar10) goto LAB_0039641b;
        if (vTempSop->pArray == (char *)0x0) {
          pcVar4 = (char *)malloc(sVar12);
        }
        else {
          pcVar4 = (char *)realloc(vTempSop->pArray,sVar12);
        }
        vTempSop->pArray = pcVar4;
      }
      vTempSop->nCap = (int)sVar12;
    }
LAB_0039641b:
    iVar3 = vTempSop->nSize;
    vTempSop->nSize = iVar3 + 1;
    vTempSop->pArray[iVar3] = ' ';
    uVar10 = vTempSop->nCap;
    if (vTempSop->nSize == uVar10) {
      if ((int)uVar10 < 0x10) {
        if (vTempSop->pArray == (char *)0x0) {
          pcVar4 = (char *)malloc(0x10);
        }
        else {
          pcVar4 = (char *)realloc(vTempSop->pArray,0x10);
        }
        sVar12 = 0x10;
      }
      else {
        sVar12 = (ulong)uVar10 * 2;
        if ((int)sVar12 <= (int)uVar10) goto LAB_00396486;
        if (vTempSop->pArray == (char *)0x0) {
          pcVar4 = (char *)malloc(sVar12);
        }
        else {
          pcVar4 = (char *)realloc(vTempSop->pArray,sVar12);
        }
      }
      vTempSop->pArray = pcVar4;
      vTempSop->nCap = (int)sVar12;
    }
LAB_00396486:
    iVar3 = vTempSop->nSize;
    vTempSop->nSize = iVar3 + 1;
    vTempSop->pArray[iVar3] = '1';
  }
  uVar10 = vTempSop->nCap;
  if (vTempSop->nSize == uVar10) {
    if ((int)uVar10 < 0x10) {
      if (vTempSop->pArray == (char *)0x0) {
        pcVar4 = (char *)malloc(0x10);
      }
      else {
        pcVar4 = (char *)realloc(vTempSop->pArray,0x10);
      }
      sVar12 = 0x10;
    }
    else {
      sVar12 = (ulong)uVar10 * 2;
      if ((int)sVar12 <= (int)uVar10) goto LAB_00396594;
      if (vTempSop->pArray == (char *)0x0) {
        pcVar4 = (char *)malloc(sVar12);
      }
      else {
        pcVar4 = (char *)realloc(vTempSop->pArray,sVar12);
      }
    }
    vTempSop->pArray = pcVar4;
    vTempSop->nCap = (int)sVar12;
  }
LAB_00396594:
  iVar3 = vTempSop->nSize;
  vTempSop->nSize = iVar3 + 1;
  vTempSop->pArray[iVar3] = '\n';
  uVar10 = vTempSop->nCap;
  if (vTempSop->nSize == uVar10) {
    if ((int)uVar10 < 0x10) {
      if (vTempSop->pArray == (char *)0x0) {
        pcVar4 = (char *)malloc(0x10);
      }
      else {
        pcVar4 = (char *)realloc(vTempSop->pArray,0x10);
      }
      sVar12 = 0x10;
    }
    else {
LAB_003965ca:
      sVar12 = (ulong)uVar10 * 2;
      if ((int)sVar12 <= (int)uVar10) goto LAB_003965ff;
      if (vTempSop->pArray == (char *)0x0) {
        pcVar4 = (char *)malloc(sVar12);
      }
      else {
        pcVar4 = (char *)realloc(vTempSop->pArray,sVar12);
      }
    }
    iVar3 = (int)sVar12;
    vTempSop->pArray = pcVar4;
LAB_003965fc:
    vTempSop->nCap = iVar3;
  }
LAB_003965ff:
  iVar3 = vTempSop->nSize;
  vTempSop->nSize = iVar3 + 1;
  vTempSop->pArray[iVar3] = '\0';
  pcVar4 = vTempSop->pArray;
  vTempSop->nCap = 0;
  vTempSop->nSize = 0;
  vTempSop->pArray = (char *)0x0;
  return pcVar4;
}

Assistant:

char * Acb_EnumerateSatAssigns( sat_solver * pSat, int PivotVar, int FreeVar, Vec_Int_t * vDivVars, Vec_Int_t * vTempLits, Vec_Str_t * vTempSop )
{
    int fCreatePrime = 1;
    int status, i, iMint, iVar, iLit, nFinal, * pFinal, pLits[2];
    Vec_Int_t * vTemp, * vLits;
    assert( FreeVar < sat_solver_nvars(pSat) );
    pLits[0] = Abc_Var2Lit( PivotVar, 1 ); // F = 1
    pLits[1] = Abc_Var2Lit( FreeVar, 0 );  // iNewLit
    Vec_StrClear( vTempSop );
    Vec_StrGrow( vTempSop, 8 * (Vec_IntSize(vDivVars) + 3) + 1 );
    // check constant 0
    status = sat_solver_solve( pSat, pLits, pLits + 2, 0, 0, 0, 0 );
    if ( status == l_False )
    {
        Vec_StrPush( vTempSop, ' ' );
        Vec_StrPush( vTempSop, '0' );
        Vec_StrPush( vTempSop, '\n' );
        Vec_StrPush( vTempSop, '\0' );
        return Vec_StrReleaseArray(vTempSop);
    }
    // check constant 1
    pLits[0] = Abc_LitNot(pLits[0]);
    status = sat_solver_solve( pSat, pLits, pLits + 2, 0, 0, 0, 0 );
    pLits[0] = Abc_LitNot(pLits[0]);
    if ( status == l_False || Vec_IntSize(vDivVars) == 0 )
    {
        Vec_StrPush( vTempSop, ' ' );
        Vec_StrPush( vTempSop, '1' );
        Vec_StrPush( vTempSop, '\n' );
        Vec_StrPush( vTempSop, '\0' );
        return Vec_StrReleaseArray(vTempSop);
    }
    //Vec_IntPrint( vDivVars );
    vTemp = Vec_IntAlloc( 100 );
    vLits = Vec_IntAlloc( 100 );
    for ( iMint = 0; ; iMint++ )
    {
        if ( iMint == 1000 )
        {
            if ( Vec_IntSize(vDivVars) == 0 )
            {
                printf( "Assuming constant 0 function.\n" );
                Vec_StrClear( vTempSop );
                Vec_StrPush( vTempSop, ' ' );
                Vec_StrPush( vTempSop, '0' );
                Vec_StrPush( vTempSop, '\n' );
                Vec_StrPush( vTempSop, '\0' );
                return Vec_StrReleaseArray(vTempSop);
            }

            printf( "Reached the limit on the number of cubes (1000).\n" );
            Vec_IntFree( vTemp );
            Vec_IntFree( vLits );
            return NULL;
        }
        //int Offset = Vec_StrSize(vTempSop);
        // find onset minterm
        status = sat_solver_solve( pSat, pLits, pLits + 2, 0, 0, 0, 0 );
        if ( status == l_False )
        {
            printf( "Finished enumerating %d cubes.\n", iMint );
            Vec_IntFree( vTemp );
            Vec_IntFree( vLits );
            Vec_StrPush( vTempSop, '\0' );
            return Vec_StrReleaseArray(vTempSop);
        }
        assert( status == l_True );
        // collect divisor literals
        Vec_IntClear( vTempLits );
        Vec_IntPush( vTempLits, Abc_LitNot(pLits[0]) ); // F = 0
        //printf( "%8d %3d  ", 0, 0 );
//        Vec_IntForEachEntry( vDivVars, iVar, i )
        Vec_IntForEachEntryReverse( vDivVars, iVar, i )
        {
            Vec_IntPush( vTempLits, sat_solver_var_literal(pSat, iVar) );
            //printf( "%c", '0' + sat_solver_var_value(pSat, iVar) );
        }
        //printf( "\n" );
        // create new cube
        for ( i = 0; i < Vec_IntSize(vDivVars); i++ )
            Vec_StrPush( vTempSop, '-' );
        if ( fCreatePrime )
        {
            // expand against offset
            status = sat_solver_push(pSat, Vec_IntEntry(vTempLits, 0));
            assert( status == 1 );
            nFinal = sat_solver_minimize_assumptions( pSat, Vec_IntArray(vTempLits)+1, Vec_IntSize(vTempLits)-1, 0 );
            Vec_IntShrink( vTempLits, nFinal+1 );
            sat_solver_pop(pSat);
            // compute cube and add clause
            Vec_IntWriteEntry( vTempLits, 0, Abc_LitNot(pLits[1]) ); // NOT(iNewLit)
            Vec_IntForEachEntryStart( vTempLits, iLit, i, 1 )
            {
                Vec_IntWriteEntry( vTempLits, i, Abc_LitNot(iLit) );
                iVar = Vec_IntFind( vDivVars, Abc_Lit2Var(iLit) );   assert( iVar >= 0 );
                //uCube &= Abc_LitIsCompl(pFinal[i]) ? s_Truths6[iVar] : ~s_Truths6[iVar];
                Vec_StrWriteEntry( vTempSop, Vec_StrSize(vTempSop) - Vec_IntSize(vDivVars) + iVar, (char)('0' + !Abc_LitIsCompl(iLit)) );
            }
        }
        else
        {
            // expand against offset
            status = sat_solver_solve( pSat, Vec_IntArray(vTempLits), Vec_IntLimit(vTempLits), 0, 0, 0, 0 );
            if ( status != l_False )
                printf( "Selected onset minterm number %d belongs to the offset (this is a bug).\n", iMint );
            assert( status == l_False );

            // compute cube and add clause
            nFinal = sat_solver_final( pSat, &pFinal );
            Vec_IntSelectSort( pFinal, nFinal );
/*
            // pretend that this is final
            veci_resize(&pSat->conf_final,0);
            Vec_IntForEachEntry( vTempLits, iLit, i )
                veci_push(&pSat->conf_final, lit_neg(iLit));
            pFinal = pSat->conf_final.ptr;
            nFinal = Vec_IntSize(vTempLits);
*/
            ////////////////////////////////////////////////////////
            // create new cube
            Vec_IntClear( vTemp );
            Vec_IntPush( vTemp, Abc_LitNot(pLits[0]) ); // F = 0
            for ( i = 0; i < nFinal; i++ )
            {
                if ( pFinal[i] == pLits[0] )
                    continue;
                Vec_IntPush( vTemp, Abc_LitNot(pFinal[i]) );
            }

            //Vec_IntPrint( vTemp );
            // try removing each one starting with the last one
            //printf( "Started with %d lits   ", nFinal-1 );
            for ( i = nFinal - 1; i > 0; i-- )
            {
                int iLit = Vec_IntEntry( vTemp, i );
                Vec_IntDrop( vTemp, i );
                // try SAT
                status = sat_solver_solve( pSat, Vec_IntArray(vTemp), Vec_IntLimit(vTemp), 0, 0, 0, 0 );
                if ( status == l_False )
                {
                //    printf( "U" );
                    continue;
                }
                //if ( status == l_True )
                //    printf( "S" );
                //else if ( status == l_Undef )
                //    printf( "T" );
                Vec_IntInsert( vTemp, i, iLit );
            }
            //printf( "   Ended up with %d lits\n", Vec_IntSize(vTemp)-1 );
            //Vec_IntPrint( vTemp );

            Vec_IntForEachEntry( vTemp, iLit, i )
                pFinal[i] = Abc_LitNot(iLit);
            nFinal = Vec_IntSize(vTemp);
            ////////////////////////////////////////////////////////


            Vec_IntClear( vTempLits );
            Vec_IntPush( vTempLits, Abc_LitNot(pLits[1]) ); // NOT(iNewLit)
            for ( i = 0; i < nFinal; i++ )
            {
                if ( pFinal[i] == pLits[0] )
                    continue;
                Vec_IntPush( vTempLits, pFinal[i] );
                iVar = Vec_IntFind( vDivVars, Abc_Lit2Var(pFinal[i]) );   assert( iVar >= 0 );
                //uCube &= Abc_LitIsCompl(pFinal[i]) ? s_Truths6[iVar] : ~s_Truths6[iVar];
                Vec_StrWriteEntry( vTempSop, Vec_StrSize(vTempSop) - Vec_IntSize(vDivVars) + iVar, (char)('0' + Abc_LitIsCompl(pFinal[i])) );
            }
        }
        //printf( "%6d : %8d %3d  ", iMint, (int)pSat->stats.conflicts, Vec_IntSize(vTempLits)-1 );

        Vec_StrAppend( vTempSop, " 1\n" );
        status = sat_solver_addclause( pSat, Vec_IntArray(vTempLits), Vec_IntLimit(vTempLits) );
        assert( status );

        //Vec_StrPush( vTempSop, '\0' );
        //printf( "%s", Vec_StrEntryP(vTempSop, Offset) );
        //Vec_StrPop( vTempSop );
    }
    assert( 0 ); 
    return NULL;
}